

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex.h
# Opt level: O3

bool __thiscall
Gudhi::cubical_complex::
is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
::operator()(is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
             *this,Simplex_handle *sh1,Simplex_handle *sh2)

{
  double dVar1;
  double dVar2;
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
  *pBVar3;
  ulong uVar4;
  pointer pdVar5;
  ulong uVar6;
  pointer puVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  
  pBVar3 = this->CC_;
  uVar4 = *sh1;
  pdVar5 = (pBVar3->super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>).
           super_Bitmap_cubical_complex_base<double>.data.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  dVar1 = pdVar5[uVar4];
  uVar6 = *sh2;
  dVar2 = pdVar5[uVar6];
  if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
    puVar7 = (pBVar3->super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>).
             super_Bitmap_cubical_complex_base<double>.multipliers.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = (long)(pBVar3->super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>).
                   super_Bitmap_cubical_complex_base<double>.multipliers.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar7 >> 2;
    uVar15 = uVar6;
    if (uVar16 < 2) {
      uVar12 = (uint)uVar4 & 1;
      iVar18 = 0;
    }
    else {
      iVar17 = 0;
      uVar14 = uVar4;
      uVar19 = uVar16;
      do {
        lVar10 = uVar19 - 1;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar14;
        auVar9 = auVar8 % ZEXT416(puVar7[lVar10]);
        uVar14 = auVar9._0_8_;
        uVar19 = uVar19 - 1;
        iVar17 = iVar17 + (SUB164(auVar8 / ZEXT416(puVar7[lVar10]),0) & 1);
      } while (1 < uVar19);
      iVar18 = 0;
      do {
        uVar14 = uVar15 / puVar7[uVar16 - 1];
        uVar15 = uVar15 % (ulong)puVar7[uVar16 - 1];
        uVar16 = uVar16 - 1;
        iVar18 = iVar18 + ((uint)uVar14 & 1);
      } while (1 < uVar16);
      uVar12 = (auVar9._0_4_ & 1) + iVar17;
    }
    uVar13 = ((uint)uVar15 & 1) + iVar18;
    bVar11 = uVar12 < uVar13;
    if (uVar12 == uVar13) {
      bVar11 = uVar4 < uVar6;
    }
    return bVar11;
  }
  return dVar1 < dVar2;
}

Assistant:

bool operator()(const typename Bitmap_cubical_complex<T>::Simplex_handle& sh1,
                  const typename Bitmap_cubical_complex<T>::Simplex_handle& sh2) const {
    // Not using st_->filtration(sh1) because it uselessly tests for null_simplex.
    typedef typename T::filtration_type Filtration_value;
    Filtration_value fil1 = CC_->data[sh1];
    Filtration_value fil2 = CC_->data[sh2];
    if (fil1 != fil2) {
      return fil1 < fil2;
    }
    // in this case they are on the same filtration level, so the dimension decide.
    std::size_t dim1 = CC_->get_dimension_of_a_cell(sh1);
    std::size_t dim2 = CC_->get_dimension_of_a_cell(sh2);
    if (dim1 != dim2) {
      return dim1 < dim2;
    }
    // in this case both filtration and dimensions of the considered cubes are the same. To have stable sort, we simply
    // compare their positions in the bitmap:
    return sh1 < sh2;
  }